

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_int_internal<long>(string *text,long *value_p)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  bool negative;
  string local_40 [16];
  long *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  bool local_1;
  
  *(undefined8 *)in_RSI = 0;
  bVar1 = safe_parse_sign(in_RSI,(bool *)CONCAT17(in_stack_ffffffffffffffe7,
                                                  in_stack_ffffffffffffffe0));
  if (bVar1) {
    if ((in_stack_ffffffffffffffe7 & 1) == 0) {
      std::__cxx11::string::string(local_40,in_RDI);
      local_1 = safe_parse_positive_int<long>
                          (in_RSI,(long *)CONCAT17(in_stack_ffffffffffffffe7,
                                                   in_stack_ffffffffffffffe0));
      std::__cxx11::string::~string(local_40);
    }
    else {
      local_1 = safe_parse_negative_int<long>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool safe_int_internal(std::string text, IntType *value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative)) {
    return false;
  }
  if (!negative) {
    return safe_parse_positive_int(text, value_p);
  } else {
    return safe_parse_negative_int(text, value_p);
  }
}